

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

char * getSelectionString(Atom selection)

{
  int iVar1;
  Window WVar2;
  char *pcVar3;
  char *local_210;
  char *string;
  size_t size;
  XEvent dummy;
  XEvent notification;
  unsigned_long bytesAfter;
  unsigned_long itemCount;
  Atom AStack_68;
  int actualFormat;
  Atom actualType;
  char *data;
  size_t i;
  size_t targetCount;
  Atom targets [2];
  char **selectionString;
  Atom selection_local;
  
  targetCount = _glfw.x11.UTF8_STRING;
  targets[0] = 0x1f;
  i = 2;
  if (selection == _glfw.x11.PRIMARY) {
    targets[1] = 0x483f20;
  }
  else {
    targets[1] = 0x483f28;
  }
  WVar2 = (*_glfw.x11.xlib.GetSelectionOwner)(_glfw.x11.display,selection);
  if (WVar2 == _glfw.x11.helperWindowHandle) {
    selection_local = *(Atom *)targets[1];
  }
  else {
    free(*(void **)targets[1]);
    *(undefined8 *)targets[1] = 0;
    for (data = (char *)0x0; data < (char *)0x2; data = data + 1) {
      (*_glfw.x11.xlib.ConvertSelection)
                (_glfw.x11.display,selection,targets[(long)(data + -1)],_glfw.x11.GLFW_SELECTION,
                 _glfw.x11.helperWindowHandle,0);
      while (iVar1 = (*_glfw.x11.xlib.CheckTypedWindowEvent)
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,
                                (XEvent *)(dummy.pad + 0x17)), iVar1 == 0) {
        waitForEvent((double *)0x0);
      }
      if (notification.xkey.subwindow != 0) {
        (*_glfw.x11.xlib.CheckIfEvent)
                  (_glfw.x11.display,(XEvent *)&size,isSelPropNewValueNotify,
                   (XPointer)(dummy.pad + 0x17));
        (*_glfw.x11.xlib.GetWindowProperty)
                  (_glfw.x11.display,(Window)notification.xany.display,notification.xkey.subwindow,0
                   ,0x7fffffffffffffff,1,0,&stack0xffffffffffffff98,(int *)((long)&itemCount + 4),
                   &bytesAfter,(unsigned_long *)(notification.pad + 0x17),(uchar **)&actualType);
        if (AStack_68 == _glfw.x11.INCR) {
          string = (char *)0x1;
          local_210 = (char *)0x0;
          do {
            while (iVar1 = (*_glfw.x11.xlib.CheckIfEvent)
                                     (_glfw.x11.display,(XEvent *)&size,isSelPropNewValueNotify,
                                      (XPointer)(dummy.pad + 0x17)), iVar1 == 0) {
              waitForEvent((double *)0x0);
            }
            (*_glfw.x11.xlib.Free)((void *)actualType);
            (*_glfw.x11.xlib.GetWindowProperty)
                      (_glfw.x11.display,(Window)notification.xany.display,
                       notification.xkey.subwindow,0,0x7fffffffffffffff,1,0,&stack0xffffffffffffff98
                       ,(int *)((long)&itemCount + 4),&bytesAfter,
                       (unsigned_long *)(notification.pad + 0x17),(uchar **)&actualType);
            if (bytesAfter != 0) {
              string = string + bytesAfter;
              local_210 = (char *)realloc(local_210,(size_t)string);
              local_210[(long)(string + (-1 - bytesAfter))] = '\0';
              strcat(local_210,(char *)actualType);
            }
          } while (bytesAfter != 0);
          if (targets[(long)(data + -1)] == 0x1f) {
            pcVar3 = convertLatin1toUTF8(local_210);
            *(char **)targets[1] = pcVar3;
            free(local_210);
          }
          else {
            *(char **)targets[1] = local_210;
          }
        }
        else if (AStack_68 == targets[(long)(data + -1)]) {
          if (targets[(long)(data + -1)] == 0x1f) {
            pcVar3 = convertLatin1toUTF8((char *)actualType);
            *(char **)targets[1] = pcVar3;
          }
          else {
            pcVar3 = _glfw_strdup((char *)actualType);
            *(char **)targets[1] = pcVar3;
          }
        }
        (*_glfw.x11.xlib.Free)((void *)actualType);
        if (*(long *)targets[1] != 0) break;
      }
    }
    if (*(long *)targets[1] == 0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
    }
    selection_local = *(Atom *)targets[1];
  }
  return (char *)selection_local;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (size_t i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}